

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O1

uint16_t __thiscall libtorrent::aux::session_impl::session_time(session_impl *this)

{
  undefined1 auVar1 [16];
  uint16_t uVar2;
  time_point tVar3;
  long lVar4;
  
  tVar3 = time_now();
  lVar4 = (long)tVar3.__d.__r - (this->m_created).__d.__r;
  auVar1 = SEXT816(lVar4) * SEXT816(0x112e0be826d694b3);
  uVar2 = 0xffff;
  if (lVar4 < 0x3b9a8e653600) {
    uVar2 = ((short)(auVar1._8_8_ >> 0x1a) + 1) - (auVar1._14_2_ >> 0xf);
  }
  return uVar2;
}

Assistant:

std::uint16_t session_time() const override
			{
				// +1 is here to make it possible to distinguish uninitialized (to
				// 0) timestamps and timestamps of things that happened during the
				// first second after the session was constructed
				std::int64_t const ret = total_seconds(aux::time_now()
					- m_created) + 1;
				TORRENT_ASSERT(ret >= 0);
				if (ret > (std::numeric_limits<std::uint16_t>::max)())
					return (std::numeric_limits<std::uint16_t>::max)();
				return static_cast<std::uint16_t>(ret);
			}